

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

ON_SubDComponentBase *
ON_SubDHeap::Internal_AllocateComponentAndSetId
          (ON_FixedSizePool *fspc,ON_SubDComponentBase **unused_list,uint *max_id,uint candidate_id)

{
  uint uVar1;
  ON_SubDComponentBase *pOVar2;
  bool bVar3;
  ON_SubDComponentBase *__s;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  ON_SubDComponentBase *pOVar7;
  
  uVar5 = 0;
  if (candidate_id < 0xb2d05e01) {
    uVar5 = candidate_id;
  }
  __s = *unused_list;
  uVar1 = *max_id;
  if (uVar1 < uVar5 || __s == (ON_SubDComponentBase *)0x0) {
    uVar6 = uVar1 + 1;
    if (uVar1 < uVar5) {
      uVar6 = uVar5;
    }
    *max_id = uVar6;
    __s = (ON_SubDComponentBase *)ON_FixedSizePool::AllocateElement(fspc);
    __s->m_id = uVar6;
  }
  else {
    uVar1 = __s->m_id;
    uVar6 = uVar1;
    if ((uVar5 != 0) && (pOVar2 = __s, uVar6 = candidate_id, uVar5 != uVar1)) {
      do {
        pOVar7 = pOVar2;
        pOVar2 = *(ON_SubDComponentBase **)&pOVar7[1].m_id;
        uVar6 = uVar1;
        if (pOVar2 == (ON_SubDComponentBase *)0x0) goto LAB_00612be2;
      } while (uVar5 != pOVar2->m_id);
      unused_list = (ON_SubDComponentBase **)&pOVar7[1].m_id;
      __s = pOVar2;
      uVar6 = uVar5;
    }
LAB_00612be2:
    *unused_list = (ON_SubDComponentBase *)*(undefined8 *)&__s[1].m_id;
    if ((__s->m_archive_id == 0xffffffff) &&
       (bVar3 = ON_ComponentStatus::IsDeleted(&__s->m_status), bVar3)) {
      sVar4 = ON_FixedSizePool::SizeofElement(fspc);
      memset(__s,0,sVar4);
    }
    else {
      ON_SubDIncrementErrorCount();
      sVar4 = ON_FixedSizePool::SizeofElement(fspc);
      memset(__s,0,sVar4);
      uVar6 = *max_id + 1;
      *max_id = uVar6;
    }
    __s->m_id = uVar6;
  }
  return __s;
}

Assistant:

class ON_SubDComponentBase* ON_SubDHeap::Internal_AllocateComponentAndSetId(
  ON_FixedSizePool& fspc,
  ON_SubDComponentBase*& unused_list,
  unsigned int& max_id,
  unsigned int candidate_id
)
{
  // fspc is a m_fspv / m_fspe / m_fspf fixed size pool on an ON_SubDHeap.
  // unused_list is the corresponding m_unused_vertex / m_unused_edge / m_unused_face list on that ON_SubDHeap.
  

  // In order for m_fspv.ElementFromId(), m_fspe.ElementFromId() , m_fspf.ElementFromId() 
  // to work, it is critical that once a vertex/edge/face is allocated from m_fspv/mfspe/mfspf
  // the value of m_id never changes.  This is important because the value of m_id must persist
  // in binary archives in order for ON_COMPONENT_INDEX values to persist in binary archives.

  ON_SubDComponentBaseLink* c;
  if (candidate_id >3000000000U)
  {
    // Requests for a candidate_id value above 3 billion are ignored to insure
    // there is plenty of room for ids. 
    // It's almost certainly a bug if candidate_id > several million or so.
    candidate_id = 0; 
  }

  if (nullptr != unused_list && candidate_id <= max_id)
  {
    ON_SubDComponentBaseLink* prev = nullptr;

    if (candidate_id > 0 && candidate_id != unused_list->m_id)
    {
      // Caller wants a specific id. If it's found here, the context is probably
      // some editing code where the caller deleted the component and now wants it back
      // to preserve the id structure.

      for (prev = static_cast<ON_SubDComponentBaseLink*>(unused_list); nullptr != prev; prev = const_cast<ON_SubDComponentBaseLink*>(prev->m_next))
      {
        // If candidate_id is somewhere in the unused list after the first element, return it.
        if (nullptr != prev->m_next && candidate_id == prev->m_next->m_id)
          break;
      }
    }

    if (nullptr != prev)
    {
      // The candidate was found somewhere in the unused_list after the first element.
      c = const_cast<ON_SubDComponentBaseLink*>(prev->m_next);
      prev->m_next = c->m_next;
    }
    else
    {
      // Return element at the head of the unused list.
      c = static_cast<ON_SubDComponentBaseLink*>(unused_list);
      unused_list = const_cast<ON_SubDComponentBaseLink*>(c->m_next);
    }
    const unsigned int id = c->m_id;
    if (ON_UNSET_UINT_INDEX == (&c->m_id)[1] && c->m_status.IsDeleted() )
    {
      // When a vertex/edge/face is put on the unused list, m_archive_id is set to ON_UNSET_UINT_INDEX and m_status = ON_ComponentStatus::Deleted.
      memset(c, 0, fspc.SizeofElement());
      c->m_id = id;
    }
    else
    {
      // Something is modifying returned elements. This is a serious bug.
      ON_SubDIncrementErrorCount();
      memset(c, 0, fspc.SizeofElement());
      c->m_id = ++max_id;
    }
  }
  else
  {
    if (candidate_id > max_id)
    {
      // Caller wants a specific id. This is common when copying subds
      // and some of the components of the original subd were deleted.
      max_id = candidate_id;
    }
    else
    {
      ////#if defined(ON_DEBUG)
      ////      // TEMPORARY ERROR CHECK added Feb 2020 to test new code. Can be removed in April 2020 or earlier if needed.
      ////      // Ask Dale Lear if confused.
      ////      if (0 != candidate_id)
      ////      {
      ////        ON_SUBD_ERROR("Unable to assign candidate_id");
      ////      }
      ////#endif
      // otherwise assign the next id to this component.
      candidate_id = ++max_id;
    }

    // allocate a new vertex.
    c = (ON_SubDComponentBaseLink*)fspc.AllocateElement();
    c->m_id = candidate_id;
  }
  return c;
}